

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dir_nav_kernel_2.cpp
# Opt level: O0

bool __thiscall dlib::file::operator==(file *this,file *rhs)

{
  long lVar1;
  char *pcVar2;
  string right;
  string left;
  char buf [4096];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffefa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffefb0;
  string local_1038 [32];
  char local_1018 [4119];
  __type local_1;
  
  lVar1 = std::__cxx11::string::size();
  if (lVar1 == 0) {
    lVar1 = std::__cxx11::string::size();
    if (lVar1 == 0) {
      local_1 = true;
      goto LAB_003d1b8f;
    }
  }
  std::__cxx11::string::string(local_1038);
  std::__cxx11::string::string((string *)&stack0xffffffffffffefa8);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  pcVar2 = realpath(pcVar2,local_1018);
  if (pcVar2 == (char *)0x0) {
    local_1 = false;
  }
  else {
    std::__cxx11::string::operator=(local_1038,local_1018);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    pcVar2 = realpath(pcVar2,local_1018);
    if (pcVar2 == (char *)0x0) {
      local_1 = false;
    }
    else {
      std::__cxx11::string::operator=((string *)&stack0xffffffffffffefa8,local_1018);
      local_1 = std::operator==(in_stack_ffffffffffffefb0,in_stack_ffffffffffffefa8);
    }
  }
  std::__cxx11::string::~string((string *)&stack0xffffffffffffefa8);
  std::__cxx11::string::~string(local_1038);
LAB_003d1b8f:
  return (bool)(local_1 & 1);
}

Assistant:

bool file::
    operator == (
        const file& rhs
    ) const 
    { 
        using namespace std;
        if (state.full_name.size() == 0 && rhs.state.full_name.size() == 0)
            return true;

        // These files might have different names but actually represent the same
        // file due to the presence of symbolic links.
        char buf[PATH_MAX];
        string left, right;
        if (realpath(state.full_name.c_str(),buf) == 0)
            return false;    
        left = buf;

        if (realpath(rhs.state.full_name.c_str(),buf) == 0)
            return false;    
        right = buf;

        return (left == right);
    }